

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuPrivate::hideUpToMenuBar(QMenuPrivate *this)

{
  int iVar1;
  QMenuBarPrivate *this_00;
  QStyle *pQVar2;
  QMenuBar *pQVar3;
  QMenu *pQVar4;
  QMenuPrivate *pQVar5;
  QMenuPrivate *in_RDI;
  byte b;
  QMenuPrivate *unaff_retaddr;
  QMenu *m;
  QMenuBar *mb;
  QWidget *caused;
  QMenuPrivate *in_stack_00000020;
  bool fadeMenus;
  QMenu *q;
  QMenu *in_stack_00000048;
  QAction *in_stack_00000068;
  QAction *in_stack_00000078;
  QWidget *local_20;
  
  this_00 = (QMenuBarPrivate *)q_func(in_RDI);
  pQVar2 = QWidget::style((QWidget *)in_RDI);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x52,0,this_00);
  b = iVar1 != 0;
  if ((*(ushort *)&in_RDI->field_0x420 >> 10 & 1) == 0) {
    local_20 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x640c24);
    hideMenu(unaff_retaddr,in_stack_00000048);
    while (local_20 != (QWidget *)0x0) {
      pQVar3 = qobject_cast<QMenuBar*>((QObject *)0x640c4d);
      if (pQVar3 == (QMenuBar *)0x0) {
        pQVar4 = qobject_cast<QMenu*>((QObject *)0x640ca0);
        if (pQVar4 == (QMenu *)0x0) {
          local_20 = (QWidget *)0x0;
        }
        else {
          QMenu::d_func((QMenu *)0x640cb7);
          local_20 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x640cc6);
          pQVar5 = QMenu::d_func((QMenu *)0x640cd5);
          if ((*(ushort *)&pQVar5->field_0x420 >> 10 & 1) == 0) {
            hideMenu(unaff_retaddr,in_stack_00000048);
          }
          if ((b & 1) == 0) {
            QMenu::d_func((QMenu *)0x640d09);
            setCurrentAction(in_stack_00000020,in_stack_00000068,caused._4_4_,
                             (SelectionReason)caused,mb._7_1_);
          }
        }
      }
      else {
        QMenuBar::d_func((QMenuBar *)0x640c64);
        QMenuBarPrivate::setCurrentAction
                  ((QMenuBarPrivate *)CONCAT17(mb._7_1_,mb._0_7_),in_stack_00000078,m._7_1_,m._6_1_)
        ;
        QMenuBar::d_func((QMenuBar *)0x640c7e);
        QMenuBarPrivate::setKeyboardMode(this_00,(bool)b);
        local_20 = (QWidget *)0x0;
      }
    }
  }
  setCurrentAction(in_stack_00000020,in_stack_00000068,caused._4_4_,(SelectionReason)caused,mb._7_1_
                  );
  return;
}

Assistant:

void QMenuPrivate::hideUpToMenuBar()
{
    Q_Q(QMenu);
    bool fadeMenus = q->style()->styleHint(QStyle::SH_Menu_FadeOutOnHide, nullptr, q);
    if (!tornoff) {
        QWidget *caused = causedPopup.widget;
        hideMenu(q); //hide after getting causedPopup
        while(caused) {
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(caused)) {
                mb->d_func()->setCurrentAction(nullptr);
                mb->d_func()->setKeyboardMode(false);
                caused = nullptr;
            } else
#endif
            if (QMenu *m = qobject_cast<QMenu*>(caused)) {
                caused = m->d_func()->causedPopup.widget;
                if (!m->d_func()->tornoff)
                    hideMenu(m);
                if (!fadeMenus) // Mac doesn't clear the action until after hidden.
                    m->d_func()->setCurrentAction(nullptr);
            } else {                caused = nullptr;
            }
        }
    }
    setCurrentAction(nullptr);
}